

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_word_validation_test.c
# Opt level: O0

void run_test(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  socklen_t *__addr_len;
  bool bVar5;
  undefined1 auStack_41558 [8];
  char boolstr [2] [100];
  char acStack_41482 [6];
  _Bool ans;
  _Bool expected_ans;
  char expected_ans_tmp [10];
  char buffer [2000];
  void *tmp_err;
  long lStack_40c98;
  _Bool err;
  size_t failed;
  automaton a;
  
  lStack_40c98 = 0;
  tmp_err._7_1_ = 0;
  load_automaton((automaton *)&failed,(_Bool *)((long)&tmp_err + 7));
  while( true ) {
    pcVar3 = fgets(expected_ans_tmp + 2,2000,_stdin);
    if (pcVar3 == (char *)0x0) break;
    sVar4 = strlen(expected_ans_tmp + 2);
    expected_ans_tmp[sVar4 + 1] = '\0';
    pcVar3 = fgets(acStack_41482,10,_stdin);
    tmp_err._7_1_ = pcVar3 == (char *)0x0;
    bVar5 = acStack_41482[0] != '0';
    iVar2 = accept((int)&failed,(sockaddr *)(expected_ans_tmp + 2),__addr_len);
    bVar1 = (bool)((byte)iVar2 & 1);
    if (bVar1 == bVar5) {
      printf("PASSED: %s\n",expected_ans_tmp + 2);
    }
    else {
      lStack_40c98 = lStack_40c98 + 1;
      printf("FAILED TEST: %s - ",expected_ans_tmp + 2);
      memcpy(auStack_41558,"false",200);
      printf("got %s instead of %s. \n",boolstr[(ulong)bVar1 - 1] + 0x5c,
             boolstr[(ulong)bVar5 - 1] + 0x5c);
    }
    printf("\n");
    expected_ans_tmp[2] = '\0';
  }
  printf("Finished, # of failed cases: %zu.\n",lStack_40c98);
  return;
}

Assistant:

void run_test() {
    automaton a;
    size_t failed = 0;
    bool err = false;
    void *tmp_err = 0;
    load_automaton(&a, &err);

    char buffer[2*WORD_LEN_MAX]; // + '\n' and '\0'
    while(fgets(buffer, sizeof(buffer), stdin)) {
        assert(strlen(buffer) < WORD_LEN_MAX +2);
        assert(buffer[strlen(buffer)-1] == '\n');
        buffer[strlen(buffer)-1] = '\0';

        // load answer for loaded word
        char expected_ans_tmp[10];
        tmp_err = fgets(expected_ans_tmp, 10, stdin);
        err = (tmp_err == NULL);
        bool expected_ans = (bool)(expected_ans_tmp[0]-'0');
        assert(expected_ans==true || expected_ans == false);

        // testing validation result
        bool ans = accept(&a, buffer);
        if(ans != expected_ans) {
            failed++;
            printf("FAILED TEST: %s - ", buffer);
            char boolstr[2][100] = {"false", "true"};
            printf("got %s instead of %s. \n", boolstr[ans], boolstr[expected_ans]);
        } else {
            printf("PASSED: %s\n", buffer);
        }
        printf("\n");
        buffer[0] = '\0';
    }
    printf("Finished, # of failed cases: %zu.\n", failed);
}